

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

Wla_Man_t * Wla_ManStart(Wlc_Ntk_t *pNtk,Wlc_Par_t *pPars)

{
  int nSize;
  Wla_Man_t *pWVar1;
  Vec_Bit_t *pVVar2;
  Pdr_Par_t *pPars_00;
  Pdr_Par_t *pPdrPars;
  Wla_Man_t *p;
  Wlc_Par_t *pPars_local;
  Wlc_Ntk_t *pNtk_local;
  
  pWVar1 = (Wla_Man_t *)calloc(1,0x80);
  pWVar1->p = pNtk;
  pWVar1->pPars = pPars;
  nSize = Wlc_NtkObjNumMax(pNtk);
  pVVar2 = Vec_BitStart(nSize);
  pWVar1->vUnmark = pVVar2;
  pPars_00 = (Pdr_Par_t *)calloc(1,0xc0);
  Pdr_ManSetDefaultParams(pPars_00);
  pPars_00->fVerbose = pPars->fPdrVerbose;
  pPars_00->fVeryVerbose = 0;
  pPars_00->pFuncStop = pPars->pFuncStop;
  pPars_00->RunId = pPars->RunId;
  if (pPars->fPdra != 0) {
    pPars_00->fUseAbs = 1;
    pPars_00->fCtgs = 1;
    pPars_00->fSkipDown = 0;
    pPars_00->nRestLimit = 500;
  }
  pWVar1->pPdrPars = pPars_00;
  pWVar1->iCexFrame = 0;
  pWVar1->fNewAbs = 0;
  pWVar1->nIters = 1;
  pWVar1->nTotalCla = 0;
  pWVar1->nDisj = 0;
  pWVar1->nNDisj = 0;
  return pWVar1;
}

Assistant:

Wla_Man_t * Wla_ManStart( Wlc_Ntk_t * pNtk, Wlc_Par_t * pPars )
{
    Wla_Man_t * p = ABC_CALLOC( Wla_Man_t, 1 );
    Pdr_Par_t * pPdrPars;
    p->p = pNtk;
    p->pPars = pPars;
    p->vUnmark = Vec_BitStart( Wlc_NtkObjNumMax(pNtk) );

    pPdrPars = ABC_CALLOC( Pdr_Par_t, 1 );
    Pdr_ManSetDefaultParams( pPdrPars );
    pPdrPars->fVerbose   = pPars->fPdrVerbose;
    pPdrPars->fVeryVerbose = 0;
    pPdrPars->pFuncStop  = pPars->pFuncStop;
    pPdrPars->RunId      = pPars->RunId;
    if ( pPars->fPdra )
    {
        pPdrPars->fUseAbs    = 1;   // use 'pdr -t'  (on-the-fly abstraction)
        pPdrPars->fCtgs      = 1;   // use 'pdr -nc' (improved generalization)
        pPdrPars->fSkipDown  = 0;   // use 'pdr -nc' (improved generalization)
        pPdrPars->nRestLimit = 500; // reset queue or proof-obligations when it gets larger than this
    } 
    p->pPdrPars = (void *)pPdrPars;

    p->iCexFrame = 0;
    p->fNewAbs   = 0;

    p->nIters    = 1;
    p->nTotalCla = 0;
    p->nDisj     = 0;
    p->nNDisj    = 0;

    return p;
}